

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_arg.c
# Opt level: O1

err_t cmdArgCreate(int *argc,char ***argv,char *args)

{
  int iVar1;
  size_t sVar2;
  char **ppcVar3;
  err_t eVar4;
  long lVar5;
  size_t sVar6;
  long lVar7;
  wordexp_t we [1];
  wordexp_t local_48;
  
  iVar1 = wordexp(args,&local_48,0);
  eVar4 = 0x6e;
  if (iVar1 == 0) {
    *argv = (char **)0x0;
    *argc = (int)local_48.we_wordc;
    if ((int)local_48.we_wordc != 0) {
      sVar6 = (long)(int)local_48.we_wordc << 3;
      if (0 < *argc) {
        lVar5 = 0;
        do {
          sVar2 = strLen(local_48.we_wordv[lVar5]);
          sVar6 = sVar6 + sVar2 + 1;
          lVar5 = lVar5 + 1;
        } while (lVar5 < *argc);
      }
      ppcVar3 = (char **)blobCreate(sVar6);
      *argv = ppcVar3;
      if (ppcVar3 == (char **)0x0) {
        wordfree(&local_48);
        return 0x6e;
      }
      if (0 < *argc) {
        lVar7 = (long)*argc << 3;
        lVar5 = 0;
        do {
          (*argv)[lVar5] = (char *)((long)*argv + lVar7);
          strCopy((*argv)[lVar5],local_48.we_wordv[lVar5]);
          sVar6 = strLen((*argv)[lVar5]);
          lVar7 = lVar7 + sVar6 + 1;
          lVar5 = lVar5 + 1;
        } while (lVar5 < *argc);
      }
    }
    wordfree(&local_48);
    eVar4 = 0;
  }
  else if (iVar1 != 1) {
    eVar4 = 0x25b;
  }
  return eVar4;
}

Assistant:

err_t cmdArgCreate(int* argc, char*** argv, const char* args)
{
	wordexp_t we[1];
	size_t count;
	int pos;
	// входной контроль
	ASSERT(strIsValid(args));
	ASSERT(memIsDisjoint2(argc, sizeof(int), argv, sizeof(char**)));
	// разбить args на строки широких символов
	switch (wordexp(args, we, 0))
	{
	case 0:
		break;
	case WRDE_NOSPACE:
		return ERR_OUTOFMEMORY;
	default:
		return ERR_CMD_PARAMS;
	}
	*argv = 0, *argc = we->we_wordc;
	// обработать отсутствие аргументов
	if (*argc == 0)
	{
		wordfree(we);
		return ERR_OK;
	}
	// перенести аргументы в блоб
	count = (size_t)(*argc) * sizeof(char*);
	for (pos = 0; pos < *argc; ++pos)
		count += strLen(we->we_wordv[pos]) + 1;
	if (!(*argv = blobCreate(count)))
	{
		wordfree(we);
		return ERR_OUTOFMEMORY;
	}
	count = (size_t)(*argc) * sizeof(char*);
	for (pos = 0; pos < *argc; ++pos)
	{
		(*argv)[pos] = (char*)*argv + count;
		strCopy((*argv)[pos], we->we_wordv[pos]);
		count += strLen((*argv)[pos]) + 1;
	}
	// завершить
	wordfree(we);
	return ERR_OK;
}